

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.cpp
# Opt level: O1

void __thiscall mpt::logfile::~logfile(logfile *this)

{
  FILE *__stream;
  
  __stream = (FILE *)this->file;
  if ((((__stream != (FILE *)0x0) && (__stream != _stdin)) && (__stream != _stdout)) &&
     (__stream != _stderr)) {
    fclose(__stream);
    return;
  }
  return;
}

Assistant:

logfile::~logfile()
{
	if (!file
	 || file == stdin
	 || file == stdout
	 || file == stderr) {
		return;
	}
	fclose(file);
}